

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsub.c
# Opt level: O3

int nn_xsub_recv(nn_sockbase *self,nn_msg *msg)

{
  int iVar1;
  uint uVar2;
  uint extraout_EAX;
  uint8_t *data;
  size_t size;
  uint8_t *in_RCX;
  int extraout_EDX;
  int iVar3;
  nn_msg *pnVar4;
  ulong uVar5;
  size_t in_R8;
  
  pnVar4 = msg;
  iVar1 = nn_fq_recv((nn_fq *)(self + 1),msg,(nn_pipe **)0x0);
  if (iVar1 != -0xb) {
    do {
      iVar3 = (int)pnVar4;
      if (iVar1 < 0) {
        nn_xsub_recv_cold_2();
        uVar2 = extraout_EAX;
LAB_001261fa:
        uVar5 = (ulong)uVar2;
        nn_xsub_recv_cold_1();
        if (iVar3 == 0x21) {
          if (extraout_EDX == 2) {
            uVar2 = nn_trie_unsubscribe((nn_trie *)(uVar5 + 0x198),in_RCX,in_R8);
          }
          else {
            if (extraout_EDX != 1) goto LAB_00126225;
            uVar2 = nn_trie_subscribe((nn_trie *)(uVar5 + 0x198),in_RCX,in_R8);
          }
          uVar2 = uVar2 & (int)uVar2 >> 0x1f;
        }
        else {
LAB_00126225:
          uVar2 = 0xffffffa4;
        }
        return uVar2;
      }
      data = (uint8_t *)nn_chunkref_data(&msg->body);
      size = nn_chunkref_size(&msg->body);
      uVar2 = nn_trie_match((nn_trie *)&self[0x19].sock,data,size);
      iVar3 = (int)data;
      if (uVar2 != 0) {
        if (uVar2 == 1) {
          return 0;
        }
        goto LAB_001261fa;
      }
      nn_msg_term(msg);
      pnVar4 = msg;
      iVar1 = nn_fq_recv((nn_fq *)(self + 1),msg,(nn_pipe **)0x0);
    } while (iVar1 != -0xb);
  }
  return -0xb;
}

Assistant:

static int nn_xsub_recv (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_xsub *xsub;

    xsub = nn_cont (self, struct nn_xsub, sockbase);

    /*  Loop while a matching message is found or when there are no more
        messages to receive. */
    while (1) {
        rc = nn_fq_recv (&xsub->fq, msg, NULL);
        if (nn_slow (rc == -EAGAIN))
            return -EAGAIN;
        errnum_assert (rc >= 0, -rc);
        rc = nn_trie_match (&xsub->trie, nn_chunkref_data (&msg->body),
            nn_chunkref_size (&msg->body));
        if (rc == 0) {
            nn_msg_term (msg);
            continue;
        }
        if (rc == 1)
            return 0;
        errnum_assert (0, -rc);
    }
}